

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  int iVar1;
  size_t sVar2;
  InternalMetadataWithArena *in_RDI;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  InternalMetadataWithArena *metadata;
  size_t local_28;
  
  local_28 = 0;
  uVar3 = *(uint *)&in_RDI[2].
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  metadata = in_RDI;
  if ((uVar3 & 0x3f) != 0) {
    if ((uVar3 & 1) != 0) {
      _internal_name_abi_cxx11_((MethodDescriptorProto *)0x505b5a);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x505b62);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 2) != 0) {
      _internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x505b85);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x505b8d);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 4) != 0) {
      _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x505bb0);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x505bb8);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 8) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>
                        ((MethodOptions *)0x505bdf);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x10) != 0) {
      local_28 = local_28 + 2;
    }
    if ((uVar3 & 0x20) != 0) {
      local_28 = local_28 + 2;
    }
  }
  if (((uint)in_RDI[1].
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         (metadata,local_28,(CachedSize *)CONCAT44(uVar3,in_stack_ffffffffffffffc0))
    ;
  }
  else {
    iVar1 = internal::ToCachedSize(local_28);
    SetCachedSize((MethodDescriptorProto *)CONCAT44(uVar3,iVar1),(int)((ulong)in_RDI >> 0x20));
  }
  return local_28;
}

Assistant:

size_t MethodDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string input_type = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_type());
    }

    // optional string output_type = 3;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_output_type());
    }

    // optional .google.protobuf.MethodOptions options = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional bool client_streaming = 5 [default = false];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool server_streaming = 6 [default = false];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}